

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Crop_x86::forward
          (Crop_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Crop *this_00;
  Mat *src;
  Mat *this_01;
  Allocator *pAVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined8 uVar12;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined8 uVar27;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  pointer pMVar38;
  int iVar39;
  ulong uVar40;
  int *piVar41;
  uint uVar42;
  ulong uVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  void *pvVar47;
  size_t sVar48;
  Option *pOVar49;
  long lVar50;
  bool bVar51;
  Mat local_188;
  int _outw;
  int _woffset;
  int _outh;
  Mat m;
  int _outc;
  int _outd;
  int _hoffset;
  ulong local_d0;
  size_t local_c8;
  int _coffset;
  int local_b8;
  uint uStack_b4;
  uint uStack_b0;
  int iStack_ac;
  Option *local_a0;
  long local_98;
  int _doffset;
  int local_8c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  undefined4 uVar6;
  undefined3 uVar8;
  undefined2 uVar10;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined3 uVar15;
  undefined1 uVar16;
  undefined2 uVar17;
  undefined1 uVar18;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined1 uVar31;
  undefined2 uVar32;
  undefined1 uVar33;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar42 = src->c;
  local_d0 = (ulong)uVar42;
  iVar46 = src->dims;
  local_188.w = src->w;
  local_188.h = src->h;
  local_188.d = src->d;
  local_188.elemsize = src->elemsize;
  iVar39 = src->elempack;
  iVar44 = src[1].elempack;
  lVar45 = (long)iVar44;
  local_188.elempack = iVar39;
  if (iVar39 != 4) goto LAB_001bd06b;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = (Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]);
  local_c8 = local_188.elemsize;
  local_b8 = iVar46;
  uStack_b4 = local_188.w;
  uStack_b0 = local_188.h;
  iStack_ac = local_188.d;
  local_a0 = opt;
  local_98 = lVar45;
  local_8c = iVar39;
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Crop_x86[-3]) != -0xe9) {
    switch(iVar46 + -1) {
    case 0:
      local_188.w = local_188.w << 2;
      local_188.dims = 1;
      local_188.h = 1;
      local_188.c = 1;
      local_188.cstep = (size_t)local_188.w;
      break;
    case 1:
      local_188.h = local_188.h << 2;
      local_188.dims = 2;
      local_188.c = 1;
      local_188.cstep = (long)local_188.h * (long)local_188.w;
      break;
    case 2:
      local_188.c = uVar42 * 4;
      local_188.dims = 3;
      local_188.cstep = (long)local_188.h * (long)local_188.w + 3U & 0x3ffffffffffffffc;
      break;
    case 3:
      local_188.c = uVar42 * 4;
      local_188.elemsize = 4;
      local_188.elempack = 1;
      local_188.dims = 4;
      local_188.cstep =
           (long)local_188.d * (long)local_188.h * (long)local_188.w + 3U & 0x3ffffffffffffffc;
      goto LAB_001bc87d;
    default:
      local_188.cstep = 0;
      local_188.elemsize = 0;
      local_188.elempack = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      goto LAB_001bc87d;
    }
    local_188.d = 1;
    local_188.elempack = 1;
    local_188.elemsize = 4;
LAB_001bc87d:
    local_188.allocator = (Allocator *)0x0;
    local_188.refcount._4_4_ = 0;
    local_188.refcount._0_4_ = 0;
    local_188.data = (void *)0x0;
    switch(src[1].dims) {
    case 1:
      m.cstep = src[1].w * lVar45;
      m.dims = 1;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      goto LAB_001bc9fd;
    case 2:
      m.w = src[1].w;
      lVar45 = src[1].h * lVar45;
      m.elemsize = 4;
      m.elempack = 1;
      m.dims = 2;
      m.h = (int)lVar45;
      m.d = 1;
      m.c = 1;
      m.cstep = lVar45 * m.w;
      break;
    case 3:
      m.w = src[1].w;
      m.h = src[1].h;
      iVar39 = src[1].c;
      m.dims = 3;
      m.d = 1;
      lVar45 = (long)m.h * (long)m.w;
      goto LAB_001bc9ec;
    case 4:
      m.w = src[1].w;
      m.h = src[1].h;
      m.d = src[1].d;
      iVar39 = src[1].c;
      m.dims = 4;
      lVar45 = (long)m.h * (long)m.w * (long)m.d;
LAB_001bc9ec:
      m.c = iVar39 * iVar44;
      m.cstep = lVar45 + 3U & 0x3ffffffffffffffc;
LAB_001bc9fd:
      m.elempack = 1;
      m.elemsize = 4;
      break;
    default:
      m.cstep = 0;
      m.elemsize = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
    m.allocator = (Allocator *)0x0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.data = (void *)0x0;
    Crop::resolve_crop_roi
              (this_00,&local_188,&m,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar41 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 != 0) goto LAB_001bcb76;
      if (local_188.allocator != (Allocator *)0x0) {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        goto LAB_001bcb76;
      }
      if (local_188.data == (void *)0x0) goto LAB_001bcb76;
      goto LAB_001bcb6e;
    }
    goto LAB_001bcb76;
  }
  switch(iVar46 + -1) {
  case 0:
    local_188.w = local_188.w << 2;
    local_188.dims = 1;
    local_188.h = 1;
    local_188.c = 1;
    local_188.cstep = (size_t)local_188.w;
    break;
  case 1:
    local_188.h = local_188.h << 2;
    local_188.dims = 2;
    local_188.c = 1;
    local_188.cstep = (long)local_188.h * (long)local_188.w;
    break;
  case 2:
    local_188.c = uVar42 * 4;
    local_188.dims = 3;
    local_188.cstep = (long)local_188.h * (long)local_188.w + 3U & 0x3ffffffffffffffc;
    break;
  case 3:
    local_188.c = uVar42 * 4;
    local_188.elemsize = 4;
    local_188.elempack = 1;
    local_188.dims = 4;
    local_188.cstep =
         (long)local_188.d * (long)local_188.h * (long)local_188.w + 3U & 0x3ffffffffffffffc;
    goto LAB_001bc7c6;
  default:
    local_188.cstep = 0;
    local_188.elemsize = 0;
    local_188.elempack = 0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    goto LAB_001bc7c6;
  }
  local_188.d = 1;
  local_188.elempack = 1;
  local_188.elemsize = 4;
LAB_001bc7c6:
  local_188.allocator = (Allocator *)0x0;
  local_188.refcount._4_4_ = 0;
  local_188.refcount._0_4_ = 0;
  local_188.data = (void *)0x0;
  Crop::resolve_crop_roi
            (this_00,&local_188,(int *)src[1].data,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  piVar41 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if (*piVar41 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
LAB_001bcb6e:
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001bcb76:
  pOVar49 = local_a0;
  if (3 < iVar46 - 1U) goto LAB_001bd02a;
  iVar44 = _coffset >> 2;
  iVar39 = _outc >> 2;
  switch(iVar46) {
  case 1:
    uVar42 = _outw & 3;
    iVar39 = (uint)(uVar42 == 0) * 3 + 1;
    uVar40 = (long)_outw % (long)iVar39;
    if (uStack_b4 == _outw / iVar39 && uVar42 == 0) {
      if (this_01 == src) {
        return 0;
      }
      piVar41 = src->refcount;
      if (piVar41 != (int *)0x0) {
        LOCK();
        *piVar41 = *piVar41 + 1;
        UNLOCK();
      }
      piVar41 = this_01->refcount;
      if (piVar41 == (int *)0x0) goto LAB_001bd883;
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 != 0) goto LAB_001bd883;
      pvVar47 = this_01->data;
      pAVar1 = this_01->allocator;
joined_r0x001bcddd:
      if (pAVar1 == (Allocator *)0x0) {
        if (pvVar47 != (void *)0x0) {
          free(pvVar47);
        }
      }
      else {
        (*pAVar1->_vptr_Allocator[3])(pAVar1,pvVar47,uVar40 & 0xffffffff);
      }
LAB_001bd883:
      this_01->cstep = 0;
      this_01->data = (void *)0x0;
      this_01->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&this_01->refcount + 4) = (undefined1  [16])0x0;
      this_01->dims = 0;
      this_01->w = 0;
      this_01->h = 0;
      this_01->d = 0;
      this_01->c = 0;
      piVar41 = src->refcount;
      this_01->data = src->data;
      this_01->refcount = piVar41;
      this_01->elemsize = src->elemsize;
      this_01->elempack = src->elempack;
      this_01->allocator = src->allocator;
      iVar39 = src->w;
      iVar44 = src->h;
      iVar46 = src->d;
      this_01->dims = src->dims;
      this_01->w = iVar39;
      this_01->h = iVar44;
      this_01->d = iVar46;
      this_01->c = src->c;
      this_01->cstep = src->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(this_01,_outw / iVar39,(local_c8 >> 2) << (uVar42 == 0) * '\x02',iVar39,
                  local_a0->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      iVar39 = _woffset + 3;
      if (-1 < _woffset) {
        iVar39 = _woffset;
      }
      crop_pack4_sse(src,this_01,0,iVar39 >> 2);
      return 0;
    }
    break;
  case 2:
    if (_outw == uStack_b4) {
      iVar39 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar40 = (long)_outh % (long)iVar39;
      if (((_outh & 3U) == 0) && (_outh / iVar39 == uStack_b0)) {
        if (this_01 == src) {
          return 0;
        }
        piVar41 = src->refcount;
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + 1;
          UNLOCK();
        }
        piVar41 = this_01->refcount;
        if (piVar41 == (int *)0x0) goto LAB_001bd883;
        LOCK();
        *piVar41 = *piVar41 + -1;
        UNLOCK();
        if (*piVar41 != 0) goto LAB_001bd883;
        pvVar47 = this_01->data;
        pAVar1 = this_01->allocator;
        goto joined_r0x001bcddd;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(this_01,_outw,_outh >> 2,(local_c8 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_a0->blob_allocator);
      if (this_01->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_01->c * this_01->cstep == 0) {
        return -100;
      }
      iVar39 = _hoffset + 3;
      if (-1 < _hoffset) {
        iVar39 = _hoffset;
      }
      crop_pack4_sse(src,this_01,iVar39 >> 2,_woffset);
      return 0;
    }
    break;
  case 3:
    sVar48 = (local_c8 >> 2) << ((_outc & 3U) == 0) * '\x02';
    uVar42 = uStack_b0 ^ _outh | uStack_b4 ^ _outw;
    bVar51 = uVar42 == 0;
    if (bVar51) {
      iVar46 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar40 = (long)_outc % (long)iVar46;
      if (((_outc & 3U) == 0) && (_outc / iVar46 == (int)local_d0)) {
        if (this_01 == src) {
          return 0;
        }
        piVar41 = src->refcount;
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + 1;
          UNLOCK();
        }
        piVar41 = this_01->refcount;
        if (piVar41 == (int *)0x0) goto LAB_001bd883;
        LOCK();
        *piVar41 = *piVar41 + -1;
        UNLOCK();
        if (*piVar41 != 0) goto LAB_001bd883;
        pvVar47 = this_01->data;
        pAVar1 = this_01->allocator;
        goto joined_r0x001bcddd;
      }
    }
    local_c8 = sVar48;
    if (((_coffset | _outc) & 3U) != 0) break;
    local_188.w = src->w;
    local_188.h = src->h;
    if (src->dims == 3) {
      local_188.elemsize = src->elemsize;
      local_188.data = (void *)((long)iVar44 * src->cstep * local_188.elemsize + (long)src->data);
      lVar45 = (long)local_188.h * (long)local_188.w * local_188.elemsize;
      local_188.d = 1;
      local_188.dims = 3;
    }
    else {
      local_188.d = src->d;
      local_188.elemsize = src->elemsize;
      local_188.data = (void *)((long)iVar44 * src->cstep * local_188.elemsize + (long)src->data);
      lVar45 = (long)local_188.h * (long)local_188.w * (long)local_188.d * local_188.elemsize;
      local_188.dims = 4;
    }
    local_188.allocator = src->allocator;
    local_188.elempack = src->elempack;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.cstep = (lVar45 + 0xfU & 0xfffffffffffffff0) / local_188.elemsize;
    local_188.c = iVar39;
    if (bVar51) {
      Mat::clone(&m,(__fn *)&local_188,(void *)0x0,CONCAT31((int3)(uVar42 >> 8),bVar51),
                 (void *)(ulong)(uint)_outh);
      piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (this_01 != &m) {
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + 1;
          UNLOCK();
        }
        piVar41 = this_01->refcount;
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + -1;
          UNLOCK();
          if (*piVar41 == 0) {
            if (this_01->allocator == (Allocator *)0x0) {
              if (this_01->data != (void *)0x0) {
                free(this_01->data);
              }
            }
            else {
              (*this_01->allocator->_vptr_Allocator[3])();
            }
          }
        }
        this_01->data = m.data;
        piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        this_01->refcount = piVar41;
        this_01->elemsize = m.elemsize;
        this_01->elempack = m.elempack;
        this_01->allocator = m.allocator;
        this_01->dims = m.dims;
        this_01->w = m.w;
        this_01->h = m.h;
        this_01->d = m.d;
        this_01->c = m.c;
        this_01->cstep = m.cstep;
      }
      if (piVar41 != (int *)0x0) {
        LOCK();
        *piVar41 = *piVar41 + -1;
        UNLOCK();
        if (*piVar41 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar39 = -100;
      if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0))
      goto LAB_001bd9ca;
    }
    else {
LAB_001bd9ca:
      iVar39 = _outc + 3;
      if (-1 < _outc) {
        iVar39 = _outc;
      }
      Mat::create(this_01,_outw,_outh,iVar39 >> 2,sVar48,4,pOVar49->blob_allocator);
      iVar39 = -100;
      if ((this_01->data != (void *)0x0) && (this_01->cstep * (long)this_01->c != 0)) {
        if (0 < this_01->c) {
          lVar45 = 0;
          do {
            m.c = 1;
            if (local_188.dims != 3) {
              m.c = local_188.d;
            }
            m.dims = local_188.dims == 3 ^ 3;
            m.data = (void *)(local_188.cstep * lVar45 * local_188.elemsize + (long)local_188.data);
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize = local_188.elemsize;
            m.elempack = local_188.elempack;
            m.allocator = local_188.allocator;
            m.w = local_188.w;
            m.h = local_188.h;
            m.cstep = (long)local_188.h * (long)local_188.w;
            m.d = 1;
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this_01->elemsize;
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(this_01->cstep * lVar45 *
                           (long)bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + (long)this_01->data);
            bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            crop_pack4_sse(&m,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
            lVar45 = lVar45 + 1;
          } while (lVar45 < this_01->c);
        }
        iVar39 = 0;
      }
    }
    piVar41 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar41 == (int *)0x0) {
      return iVar39;
    }
    LOCK();
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if (*piVar41 != 0) {
      return iVar39;
    }
    if (local_188.allocator != (Allocator *)0x0) {
      (*(local_188.allocator)->_vptr_Allocator[3])();
      return iVar39;
    }
joined_r0x001bd86f:
    local_188.allocator = (Allocator *)0x0;
    if (local_188.data == (void *)0x0) {
      return iVar39;
    }
    goto LAB_001bd3c6;
  case 4:
    sVar48 = (local_c8 >> 2) << ((_outc & 3U) == 0) * '\x02';
    bVar51 = uStack_b4 == _outd;
    bVar2 = uStack_b0 == _outh;
    bVar3 = uStack_b4 == _outw;
    if (bVar51 && (bVar2 && bVar3)) {
      iVar46 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar40 = (long)_outc % (long)iVar46;
      if (((_outc & 3U) == 0) && (_outc / iVar46 == (int)local_d0)) {
        if (this_01 == src) {
          return 0;
        }
        piVar41 = src->refcount;
        if (piVar41 != (int *)0x0) {
          LOCK();
          *piVar41 = *piVar41 + 1;
          UNLOCK();
        }
        piVar41 = this_01->refcount;
        if (piVar41 == (int *)0x0) goto LAB_001bd883;
        LOCK();
        *piVar41 = *piVar41 + -1;
        UNLOCK();
        if (*piVar41 != 0) goto LAB_001bd883;
        pvVar47 = this_01->data;
        pAVar1 = this_01->allocator;
        goto joined_r0x001bcddd;
      }
    }
    local_c8 = sVar48;
    if (((_coffset | _outc) & 3U) == 0) {
      local_d0 = CONCAT71(local_d0._1_7_,bVar51 && (bVar2 && bVar3));
      local_188.w = src->w;
      local_188.h = src->h;
      if (src->dims == 3) {
        local_188.elemsize = src->elemsize;
        local_188.data = (void *)((long)iVar44 * src->cstep * local_188.elemsize + (long)src->data);
        lVar45 = (long)local_188.h * (long)local_188.w * local_188.elemsize;
        local_188.d = 1;
        pvVar47 = (void *)0x3;
      }
      else {
        local_188.d = src->d;
        local_188.elemsize = src->elemsize;
        local_188.data = (void *)((long)iVar44 * src->cstep * local_188.elemsize + (long)src->data);
        lVar45 = (long)local_188.h * (long)local_188.w * (long)local_188.d * local_188.elemsize;
        pvVar47 = (void *)0x4;
      }
      local_188.allocator = src->allocator;
      local_188.elempack = src->elempack;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.dims = (int)pvVar47;
      local_188.cstep = (lVar45 + 0xfU & 0xfffffffffffffff0) / local_188.elemsize;
      local_188.c = iVar39;
      if (bVar51 && (bVar2 && bVar3)) {
        Mat::clone(&m,(__fn *)&local_188,(void *)0x0,_outd,pvVar47);
        pOVar49 = local_a0;
        sVar48 = local_c8;
        Mat::operator=(this_01,&m);
        Mat::~Mat(&m);
        iVar39 = -100;
        if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0))
        goto LAB_001bd5db;
      }
      else {
LAB_001bd5db:
        iVar39 = _outc + 3;
        if (-1 < _outc) {
          iVar39 = _outc;
        }
        Mat::create(this_01,_outw,_outh,_outd,iVar39 >> 2,sVar48,4,pOVar49->blob_allocator);
        iVar39 = -100;
        if (this_01->data != (void *)0x0) {
          uVar40 = (ulong)this_01->c;
          if (this_01->cstep * uVar40 != 0) {
            if (0 < this_01->c) {
              uVar43 = (ulong)(uint)_outd;
              lVar45 = 0;
              do {
                if (0 < (int)uVar43) {
                  lVar50 = 0;
                  do {
                    m.cstep = (long)local_188.h * (long)local_188.w;
                    m.data = (void *)((long)local_188.data +
                                     (long)(_doffset + (int)lVar50) * local_188.elemsize * m.cstep +
                                     local_188.cstep * lVar45 * local_188.elemsize);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize = local_188.elemsize;
                    m.elempack = local_188.elempack;
                    m.allocator = local_188.allocator;
                    m.dims = 2;
                    m.w = local_188.w;
                    m.h = local_188.h;
                    m.d = 1;
                    m.c = 1;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_01->elemsize;
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)this_01->data +
                                  lVar50 * (long)bottom_blobs_unpacked.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  * (long)this_01->h * (long)this_01->w +
                                  this_01->cstep * lVar45 *
                                  (long)bottom_blobs_unpacked.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    crop_pack4_sse(&m,(Mat *)&bottom_blobs_unpacked,_hoffset,_woffset);
                    uVar43 = (ulong)_outd;
                    lVar50 = lVar50 + 1;
                  } while (lVar50 < (long)uVar43);
                  uVar40 = (ulong)(uint)this_01->c;
                }
                lVar45 = lVar45 + 1;
              } while (lVar45 < (int)uVar40);
            }
            iVar39 = 0;
          }
        }
      }
      piVar41 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar41 == (int *)0x0) {
        return iVar39;
      }
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 != 0) {
        return iVar39;
      }
      if (local_188.allocator != (Allocator *)0x0) {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        return iVar39;
      }
      goto joined_r0x001bd86f;
    }
  }
LAB_001bd02a:
  local_188.elemsize = src->elemsize;
  iVar46 = src->dims;
  local_188.w = src->w;
  local_188.h = src->h;
  local_188.d = src->d;
  local_d0 = (ulong)(uint)src->c;
  iVar44 = (int)local_98;
  opt = local_a0;
  iVar39 = local_8c;
  local_188.elempack = src->elempack;
LAB_001bd06b:
  local_188.data = src->data;
  piVar41 = src->refcount;
  local_188.refcount._0_4_ = SUB84(piVar41,0);
  local_188.refcount._4_4_ = (undefined4)((ulong)piVar41 >> 0x20);
  local_188.allocator = src->allocator;
  local_188.c = (int)local_d0;
  local_188.cstep = src->cstep;
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + 1;
    UNLOCK();
  }
  local_188.dims = iVar46;
  if (iVar39 != 1) {
    m.data = *(void **)opt;
    m.elemsize = (size_t)opt->workspace_allocator;
    uVar4 = opt->openmp_blocktime;
    uVar5 = opt->use_winograd_convolution;
    uVar7 = opt->use_sgemm_convolution;
    uVar9 = opt->use_int8_inference;
    uVar11 = opt->use_vulkan_compute;
    uVar10 = CONCAT11(uVar11,uVar9);
    uVar8 = CONCAT21(uVar10,uVar7);
    uVar6 = CONCAT31(uVar8,uVar5);
    m.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar12._0_1_ = opt->use_shader_pack8;
    uVar12._1_1_ = opt->use_subgroup_basic;
    uVar12._2_1_ = opt->use_subgroup_vote;
    uVar12._3_1_ = opt->use_subgroup_ballot;
    uVar13 = opt->use_subgroup_shuffle;
    uVar14 = opt->use_image_storage;
    uVar16 = opt->use_tensor_storage;
    uVar18 = opt->use_weight_fp16_storage;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar12._4_4_ = CONCAT31(uVar15,uVar13);
    uVar19 = opt->flush_denormals;
    uVar20 = opt->use_local_pool_allocator;
    uVar22 = opt->use_reserved_1;
    uVar24 = opt->use_reserved_2;
    uVar26 = opt->use_reserved_3;
    uVar25 = CONCAT11(uVar26,uVar24);
    uVar23 = CONCAT21(uVar25,uVar22);
    uVar21 = CONCAT31(uVar23,uVar20);
    uVar27._0_1_ = opt->use_reserved_4;
    uVar27._1_1_ = opt->use_reserved_5;
    uVar27._2_1_ = opt->use_reserved_6;
    uVar27._3_1_ = opt->use_reserved_7;
    uVar28 = opt->use_reserved_8;
    uVar29 = opt->use_reserved_9;
    uVar31 = opt->use_reserved_10;
    uVar33 = opt->use_reserved_11;
    uVar32 = CONCAT11(uVar33,uVar31);
    uVar30 = CONCAT21(uVar32,uVar29);
    uVar27._4_4_ = CONCAT31(uVar30,uVar28);
    m.c = (int)uVar27;
    m.dims = (int)uVar12;
    m.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    m.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    m.elempack = uVar4;
    m._28_4_ = uVar6;
    m.w = uVar12._4_4_;
    m.h = uVar19;
    m.d = uVar21;
    m._60_4_ = uVar27._4_4_;
    convert_packing(src,&local_188,1,(Option *)&m);
  }
  m.data = src[1].data;
  piVar41 = src[1].refcount;
  m.refcount._0_4_ = SUB84(piVar41,0);
  m.refcount._4_4_ = (undefined4)((ulong)piVar41 >> 0x20);
  m.elemsize = src[1].elemsize;
  m.elempack = src[1].elempack;
  m.allocator = src[1].allocator;
  uVar34 = src[1].dims;
  uVar35 = src[1].w;
  uVar36 = src[1].h;
  uVar37 = src[1].d;
  m.c = src[1].c;
  m.cstep = src[1].cstep;
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + 1;
    UNLOCK();
  }
  m.dims = uVar34;
  m.w = uVar35;
  m.h = uVar36;
  m.d = uVar37;
  if (iVar44 != 1) {
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)opt->workspace_allocator;
    bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)opt->workspace_allocator;
    convert_packing(src + 1,&m,1,(Option *)&bottom_blobs_unpacked);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs_unpacked,2,(allocator_type *)&_woffset);
  pMVar38 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &local_188) {
    piVar41 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + 1;
      UNLOCK();
    }
    piVar41 = (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->refcount;
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 == 0) {
        if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar38->cstep = 0;
    pMVar38->data = (void *)0x0;
    pMVar38->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&pMVar38->refcount + 4) = (undefined1  [16])0x0;
    pMVar38->dims = 0;
    pMVar38->w = 0;
    pMVar38->h = 0;
    pMVar38->d = 0;
    pMVar38->c = 0;
    pMVar38->data = local_188.data;
    pMVar38->refcount = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    pMVar38->elemsize = local_188.elemsize;
    pMVar38->elempack = local_188.elempack;
    pMVar38->allocator = local_188.allocator;
    pMVar38->dims = local_188.dims;
    pMVar38->w = local_188.w;
    pMVar38->h = local_188.h;
    pMVar38->d = local_188.d;
    pMVar38->c = local_188.c;
    pMVar38->cstep = local_188.cstep;
  }
  pMVar38 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start + 1 != &m) {
    piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + 1;
      UNLOCK();
    }
    piVar41 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start[1].refcount;
    if (piVar41 != (int *)0x0) {
      LOCK();
      *piVar41 = *piVar41 + -1;
      UNLOCK();
      if (*piVar41 == 0) {
        if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          if (bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
            free(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].data);
          }
        }
        else {
          (*(bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
             .super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pMVar38[1].data = m.data;
    pMVar38[1].refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar38[1].elemsize = m.elemsize;
    pMVar38[1].elempack = m.elempack;
    pMVar38[1].allocator = m.allocator;
    pMVar38[1].dims = m.dims;
    pMVar38[1].w = m.w;
    pMVar38[1].h = m.h;
    pMVar38[1].d = m.d;
    pMVar38[1].c = m.c;
    pMVar38[1].cstep = m.cstep;
  }
  iVar39 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),
                         &bottom_blobs_unpacked,top_blobs,opt);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
  piVar41 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if (*piVar41 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar41 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar41 != (int *)0x0) {
    LOCK();
    *piVar41 = *piVar41 + -1;
    UNLOCK();
    if (*piVar41 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
LAB_001bd3c6:
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

int Crop_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int ref_elempack = reference_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        if (woffset == -233)
        {
            resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }
        else
        {
            resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
        }

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    Mat reference_blob_unpacked = reference_blob;
    if (ref_elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(reference_blob, reference_blob_unpacked, 1, opt_pack1);
    }

    std::vector<Mat> bottom_blobs_unpacked(2);
    bottom_blobs_unpacked[0] = bottom_blob_unpacked;
    bottom_blobs_unpacked[1] = reference_blob_unpacked;

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}